

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ircode.c
# Opt level: O3

void ircode_free(ircode_t *code)

{
  _Bool **__ptr;
  uint32_t *puVar1;
  code_r *pcVar2;
  ulong uVar3;
  ulong uVar4;
  
  pcVar2 = code->list;
  uVar3 = (ulong)(uint)pcVar2->n;
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      free(code->list->p[uVar4]);
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
    pcVar2 = code->list;
  }
  if (pcVar2->p != (inst_t **)0x0) {
    free(pcVar2->p);
  }
  __ptr = (code->context).p;
  if (__ptr != (_Bool **)0x0) {
    free(__ptr);
  }
  puVar1 = (code->registers).p;
  if (puVar1 != (uint32_t *)0x0) {
    free(puVar1);
  }
  puVar1 = (code->label_true).p;
  if (puVar1 != (uint32_t *)0x0) {
    free(puVar1);
  }
  puVar1 = (code->label_false).p;
  if (puVar1 != (uint32_t *)0x0) {
    free(puVar1);
  }
  puVar1 = (code->label_check).p;
  if (puVar1 != (uint32_t *)0x0) {
    free(puVar1);
  }
  free(code->list);
  free(code);
  return;
}

Assistant:

void ircode_free (ircode_t *code) {
    uint32_t count = ircode_count(code);
    for (uint32_t i=0; i<count; ++i) {
        inst_t *inst = marray_get(*code->list, i);
        mem_free(inst);
    }

    marray_destroy(*code->list);
    marray_destroy(code->context);
    marray_destroy(code->registers);
    marray_destroy(code->label_true);
    marray_destroy(code->label_false);
    marray_destroy(code->label_check);
    mem_free(code->list);
    mem_free(code);
}